

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

int __thiscall QSQLiteDriver::open(QSQLiteDriver *this,char *__file,int __oflag,...)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int nArg;
  QSQLiteDriverPrivate *pQVar4;
  ulong uVar5;
  QStringView *pQVar6;
  undefined8 uVar7;
  void *pvVar8;
  char *extraout_RDX;
  long in_FS_OFFSET;
  QCache<QString,_QRegularExpression> *cache;
  int res;
  int openMode;
  int cacheSize;
  int nt;
  QList<QStringView> *__range1;
  int regexpCacheSize;
  bool defineRegexp;
  bool openNoFollow;
  bool useQtCaseFolding;
  bool useQtVfs;
  bool useExtendedResultCodes;
  bool openUriOption;
  bool openReadOnlyOption;
  bool sharedCache;
  int timeOut;
  QSQLiteDriverPrivate *d;
  bool ok_1;
  bool ok;
  QStringView option;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QStringView> opts;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_fffffffffffffd38;
  int n;
  sqlite3 *in_stack_fffffffffffffd40;
  QStringView *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  QStringView *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  ErrorType in_stack_fffffffffffffd64;
  int in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  QLatin1StringView in_stack_fffffffffffffd98;
  undefined1 local_201;
  QSqlError local_1e8 [32];
  QString local_1c8;
  char local_1b0 [32];
  QStringView local_190;
  QStringView local_180;
  byte local_16b;
  QChar local_16a;
  QStringView local_168;
  QStringView local_158;
  qsizetype local_148;
  char *local_140;
  QLatin1StringView local_138;
  QLatin1StringView local_128;
  QLatin1StringView local_118;
  QLatin1StringView local_108;
  QLatin1StringView local_f8;
  QLatin1StringView local_e8;
  QLatin1StringView local_d8;
  QStringView local_c8;
  QStringView local_b8;
  undefined1 local_a3;
  QChar local_a2;
  QStringView local_a0;
  QStringView local_90;
  QStringView local_80;
  undefined1 *local_70;
  storage_type *local_68;
  QStringView *local_60;
  const_iterator local_58;
  const_iterator local_50;
  QChar local_42;
  undefined1 local_40 [16];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QSQLiteDriver *)0x117216);
  uVar5 = (*((sqlite3 *)this)->pVfs->xDlClose)((sqlite3_vfs *)this,__file);
  if ((uVar5 & 1) != 0) {
    (*(code *)((sqlite3 *)this)->pVfs[1].zName)();
  }
  bVar2 = false;
  bVar1 = false;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
             (QString *)in_stack_fffffffffffffd48);
  QChar::QChar<char16_t,_true>(&local_42,L';');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_fffffffffffffd40,
             (SplitBehaviorFlags)((ulong)in_stack_fffffffffffffd38 >> 0x20));
  QStringView::split((QChar)(char16_t)&local_30,(QFlags *)local_40,(uint)(ushort)local_42.ucs);
  local_50.i = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_50 = QList<QStringView>::begin((QList<QStringView> *)in_stack_fffffffffffffd40);
  local_58.i = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = QList<QStringView>::end((QList<QStringView> *)in_stack_fffffffffffffd40);
  while( true ) {
    local_60 = local_58.i;
    bVar3 = QList<QStringView>::const_iterator::operator!=(&local_50,local_58);
    if (!bVar3) break;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QList<QStringView>::const_iterator::operator*(&local_50);
    local_70 = (undefined1 *)pQVar6->m_size;
    local_68 = pQVar6->m_data;
    local_80 = QStringView::trimmed(in_stack_fffffffffffffd48);
    local_70 = (undefined1 *)local_80.m_size;
    local_68 = local_80.m_data;
    in_stack_fffffffffffffd98 =
         Qt::Literals::StringLiterals::operator____L1
                   ((char *)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
    s.m_size._4_4_ = in_stack_fffffffffffffd64;
    s.m_size._0_4_ = in_stack_fffffffffffffd60;
    s.m_data._0_4_ = in_stack_fffffffffffffd68;
    s.m_data._4_4_ = in_stack_fffffffffffffd6c;
    bVar3 = QStringView::startsWith((QStringView *)in_stack_fffffffffffffd38,s,CaseInsensitive);
    if (bVar3) {
      local_a0 = QStringView::mid(in_stack_fffffffffffffd58,
                                  CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                                  CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      local_90 = QStringView::trimmed(in_stack_fffffffffffffd48);
      local_70 = (undefined1 *)local_90.m_size;
      local_68 = local_90.m_data;
      QChar::QChar<char16_t,_true>(&local_a2,L'=');
      bVar3 = QStringView::startsWith
                        ((QStringView *)
                         CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                         (QChar)(char16_t)((ulong)in_stack_fffffffffffffd58 >> 0x30));
      if (bVar3) {
        local_a3 = 0xaa;
        local_c8 = QStringView::mid(in_stack_fffffffffffffd58,
                                    CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                                    CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        local_b8 = QStringView::trimmed(in_stack_fffffffffffffd48);
        in_stack_fffffffffffffd94 =
             QStringView::toInt(in_stack_fffffffffffffd48,(bool *)in_stack_fffffffffffffd40,
                                (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      }
    }
    else {
      local_d8 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
      bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                         (QLatin1StringView *)in_stack_fffffffffffffd38);
      if (!bVar3) {
        local_e8 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40);
        bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                           (QLatin1StringView *)in_stack_fffffffffffffd38);
        if (!bVar3) {
          local_f8 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40)
          ;
          bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                             (QLatin1StringView *)in_stack_fffffffffffffd38);
          if (!bVar3) {
            local_108 = Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffffd48,
                                   (size_t)in_stack_fffffffffffffd40);
            bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                               (QLatin1StringView *)in_stack_fffffffffffffd38);
            if (!bVar3) {
              local_118 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffffd48,
                                     (size_t)in_stack_fffffffffffffd40);
              bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                                 (QLatin1StringView *)in_stack_fffffffffffffd38);
              if (!bVar3) {
                local_128 = Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffffd48,
                                       (size_t)in_stack_fffffffffffffd40);
                bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                                   (QLatin1StringView *)in_stack_fffffffffffffd38);
                if (bVar3) {
                  bVar2 = true;
                }
                else {
                  local_138 = Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffffd48,
                                         (size_t)in_stack_fffffffffffffd40);
                  bVar3 = operator==((QStringView *)in_stack_fffffffffffffd40,
                                     (QLatin1StringView *)in_stack_fffffffffffffd38);
                  if (!bVar3) {
                    local_148 = 0x15;
                    local_140 = "QSQLITE_ENABLE_REGEXP";
                    s_00.m_size._4_4_ = in_stack_fffffffffffffd64;
                    s_00.m_size._0_4_ = in_stack_fffffffffffffd60;
                    s_00.m_data._0_4_ = in_stack_fffffffffffffd68;
                    s_00.m_data._4_4_ = in_stack_fffffffffffffd6c;
                    bVar3 = QStringView::startsWith
                                      ((QStringView *)in_stack_fffffffffffffd38,s_00,CaseInsensitive
                                      );
                    if (bVar3) {
                      QLatin1String::size(&open::regexpConnectOption);
                      local_168 = QStringView::mid(in_stack_fffffffffffffd58,
                                                   CONCAT44(in_stack_fffffffffffffd6c,
                                                            in_stack_fffffffffffffd68),
                                                   CONCAT44(in_stack_fffffffffffffd64,
                                                            in_stack_fffffffffffffd60));
                      local_158 = QStringView::trimmed(in_stack_fffffffffffffd48);
                      local_70 = (undefined1 *)local_158.m_size;
                      local_68 = local_158.m_data;
                      bVar3 = QStringView::isEmpty((QStringView *)0x11783c);
                      if (bVar3) {
                        bVar1 = true;
                      }
                      else {
                        QChar::QChar<char16_t,_true>(&local_16a,L'=');
                        bVar3 = QStringView::startsWith
                                          ((QStringView *)
                                           CONCAT17(in_stack_fffffffffffffd57,
                                                    in_stack_fffffffffffffd50),
                                           (QChar)(char16_t)
                                                  ((ulong)in_stack_fffffffffffffd58 >> 0x30));
                        if (bVar3) {
                          local_16b = 0;
                          local_190 = QStringView::mid(in_stack_fffffffffffffd58,
                                                       CONCAT44(in_stack_fffffffffffffd6c,
                                                                in_stack_fffffffffffffd68),
                                                       CONCAT44(in_stack_fffffffffffffd64,
                                                                in_stack_fffffffffffffd60));
                          local_180 = QStringView::trimmed(in_stack_fffffffffffffd48);
                          in_stack_fffffffffffffd90 =
                               QStringView::toInt(in_stack_fffffffffffffd48,
                                                  (bool *)in_stack_fffffffffffffd40,
                                                  (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
                          if ((local_16b & 1) != 0) {
                            bVar1 = true;
                          }
                        }
                      }
                    }
                    else {
                      local_18 = &DAT_aaaaaaaaaaaaaaaa;
                      local_10 = &DAT_aaaaaaaaaaaaaaaa;
                      lcSqlite();
                      anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
                      QLoggingCategoryMacroHolder
                                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
                      while (bVar3 = (anonymous_namespace)::QLoggingCategoryMacroHolder::
                                     operator_cast_to_bool((QLoggingCategoryMacroHolder *)&local_18)
                            , bVar3) {
                        anon_unknown.dwarf_2053b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x117967);
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)
                                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                                   (char *)in_stack_fffffffffffffd48,
                                   (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                                   (char *)in_stack_fffffffffffffd38,(char *)0x117980);
                        QStringView::toString((QStringView *)in_stack_fffffffffffffd40);
                        QtPrivate::asString(&local_1c8);
                        uVar7 = QString::utf16();
                        QMessageLogger::warning(local_1b0,"Unsupported option \'%ls\'",uVar7);
                        QString::~QString((QString *)0x1179d0);
                        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    QList<QStringView>::const_iterator::operator++(&local_50);
  }
  QString::toUtf8((QString *)in_stack_fffffffffffffd38);
  QByteArray::constData((QByteArray *)0x117a95);
  nArg = sqlite3_open_v2((char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                         (sqlite3 **)in_stack_fffffffffffffd48,
                         (int)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                         (char *)in_stack_fffffffffffffd38);
  QByteArray::~QByteArray((QByteArray *)0x117ad9);
  n = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  if (nArg == 0) {
    sqlite3_busy_timeout(in_stack_fffffffffffffd40,n);
    sqlite3_extended_result_codes
              (in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
    (*((sqlite3 *)this)->pVfs[1].xRandomness)((sqlite3_vfs *)this,1,extraout_RDX);
    (*((sqlite3 *)this)->pVfs[1].xSleep)((sqlite3_vfs *)this,0);
    if (bVar1) {
      pvVar8 = operator_new(0x48);
      in_stack_fffffffffffffd60 = (int)pvVar8;
      in_stack_fffffffffffffd64 = (ErrorType)((ulong)pvVar8 >> 0x20);
      QCache<QString,_QRegularExpression>::QCache
                ((QCache<QString,_QRegularExpression> *)in_stack_fffffffffffffd40,
                 (qsizetype)in_stack_fffffffffffffd38);
      sqlite3_create_function_v2
                ((sqlite3 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (char *)this,nArg,in_stack_fffffffffffffd68,
                 (void *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 in_stack_fffffffffffffd58,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (_func_void_sqlite3_context_ptr *)in_stack_fffffffffffffd98.m_size,
                 (_func_void_void_ptr *)in_stack_fffffffffffffd98.m_data);
    }
    if (bVar2) {
      sqlite3_create_function_v2
                ((sqlite3 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (char *)this,nArg,in_stack_fffffffffffffd68,
                 (void *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 in_stack_fffffffffffffd58,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (_func_void_sqlite3_context_ptr *)in_stack_fffffffffffffd98.m_size,
                 (_func_void_void_ptr *)in_stack_fffffffffffffd98.m_data);
      sqlite3_create_function_v2
                ((sqlite3 *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                 (char *)this,nArg,in_stack_fffffffffffffd68,
                 (void *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 in_stack_fffffffffffffd58,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (_func_void_sqlite3_context_ptr *)in_stack_fffffffffffffd98.m_size,
                 (_func_void_void_ptr *)in_stack_fffffffffffffd98.m_data);
    }
    local_201 = 1;
  }
  else {
    tr((char *)in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40,n);
    qMakeError((sqlite3 *)this,(QString *)CONCAT44(nArg,in_stack_fffffffffffffd68),
               in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
    (*((sqlite3 *)this)->pVfs[1].xCurrentTime)((sqlite3_vfs *)this,(double *)local_1e8);
    QSqlError::~QSqlError(local_1e8);
    QString::~QString((QString *)0x117cfc);
    (*((sqlite3 *)this)->pVfs[1].xSleep)((sqlite3_vfs *)this,1);
    if (pQVar4->access != (sqlite3 *)0x0) {
      sqlite3_close((sqlite3 *)0x117d35);
      pQVar4->access = (sqlite3 *)0x0;
    }
    local_201 = 0;
  }
  QList<QStringView>::~QList((QList<QStringView> *)0x117d65);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_201);
}

Assistant:

bool QSQLiteDriver::open(const QString & db, const QString &, const QString &, const QString &, int, const QString &conOpts)
{
    Q_D(QSQLiteDriver);
    if (isOpen())
        close();


    int timeOut = 5000;
    bool sharedCache = false;
    bool openReadOnlyOption = false;
    bool openUriOption = false;
    bool useExtendedResultCodes = true;
    bool useQtVfs = false;
    bool useQtCaseFolding = false;
    bool openNoFollow = false;
#if QT_CONFIG(regularexpression)
    static const auto regexpConnectOption = "QSQLITE_ENABLE_REGEXP"_L1;
    bool defineRegexp = false;
    int regexpCacheSize = 25;
#endif

    const auto opts = QStringView{conOpts}.split(u';', Qt::SkipEmptyParts);
    for (auto option : opts) {
        option = option.trimmed();
        if (option.startsWith("QSQLITE_BUSY_TIMEOUT"_L1)) {
            option = option.mid(20).trimmed();
            if (option.startsWith(u'=')) {
                bool ok;
                const int nt = option.mid(1).trimmed().toInt(&ok);
                if (ok)
                    timeOut = nt;
            }
        } else if (option == "QSQLITE_USE_QT_VFS"_L1) {
            useQtVfs = true;
        } else if (option == "QSQLITE_OPEN_READONLY"_L1) {
            openReadOnlyOption = true;
        } else if (option == "QSQLITE_OPEN_URI"_L1) {
            openUriOption = true;
        } else if (option == "QSQLITE_ENABLE_SHARED_CACHE"_L1) {
            sharedCache = true;
        } else if (option == "QSQLITE_NO_USE_EXTENDED_RESULT_CODES"_L1) {
            useExtendedResultCodes = false;
        } else if (option == "QSQLITE_ENABLE_NON_ASCII_CASE_FOLDING"_L1) {
            useQtCaseFolding = true;
        } else if (option == "QSQLITE_OPEN_NOFOLLOW"_L1) {
            openNoFollow = true;
        }
#if QT_CONFIG(regularexpression)
        else if (option.startsWith(regexpConnectOption)) {
            option = option.mid(regexpConnectOption.size()).trimmed();
            if (option.isEmpty()) {
                defineRegexp = true;
            } else if (option.startsWith(u'=')) {
                bool ok = false;
                const int cacheSize = option.mid(1).trimmed().toInt(&ok);
                if (ok) {
                    defineRegexp = true;
                    if (cacheSize > 0)
                        regexpCacheSize = cacheSize;
                }
            }
        }
#endif
        else
            qCWarning(lcSqlite, "Unsupported option '%ls'", qUtf16Printable(option.toString()));
    }

    int openMode = (openReadOnlyOption ? SQLITE_OPEN_READONLY : (SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE));
    openMode |= (sharedCache ? SQLITE_OPEN_SHAREDCACHE : SQLITE_OPEN_PRIVATECACHE);
    if (openUriOption)
        openMode |= SQLITE_OPEN_URI;
    if (openNoFollow) {
#if defined(SQLITE_OPEN_NOFOLLOW)
        openMode |= SQLITE_OPEN_NOFOLLOW;
#else
        qCWarning(lcSqlite, "SQLITE_OPEN_NOFOLLOW not supported with the SQLite version %s", sqlite3_libversion());
#endif
    }

    openMode |= SQLITE_OPEN_NOMUTEX;

    const int res = sqlite3_open_v2(db.toUtf8().constData(), &d->access, openMode, useQtVfs ? "QtVFS" : nullptr);

    if (res == SQLITE_OK) {
        sqlite3_busy_timeout(d->access, timeOut);
        sqlite3_extended_result_codes(d->access, useExtendedResultCodes);
        setOpen(true);
        setOpenError(false);
#if QT_CONFIG(regularexpression)
        if (defineRegexp) {
            auto cache = new QCache<QString, QRegularExpression>(regexpCacheSize);
            sqlite3_create_function_v2(d->access, "regexp", 2, SQLITE_UTF8, cache,
                                       &_q_regexp, nullptr,
                                       nullptr, &_q_regexp_cleanup);
        }
#endif
        if (useQtCaseFolding) {
            sqlite3_create_function_v2(d->access, "lower", 1, SQLITE_UTF8, nullptr,
                                       &_q_lower, nullptr, nullptr, nullptr);
            sqlite3_create_function_v2(d->access, "upper", 1, SQLITE_UTF8, nullptr,
                                       &_q_upper, nullptr, nullptr, nullptr);
        }
        return true;
    } else {
        setLastError(qMakeError(d->access, tr("Error opening database"),
                     QSqlError::ConnectionError, res));
        setOpenError(true);

        if (d->access) {
            sqlite3_close(d->access);
            d->access = nullptr;
        }

        return false;
    }
}